

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

mp_limb_t mpn_div_qr_1_preinv(mp_ptr qp,mp_srcptr np,mp_size_t nn,gmp_div_inverse *inv)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  mp_ptr pmVar8;
  long lVar9;
  uint *in_RCX;
  mp_size_t in_RDX;
  mp_srcptr in_RSI;
  mp_ptr in_RDI;
  mp_limb_t __x;
  mp_limb_t __v;
  mp_limb_t __u;
  uint __vh;
  uint __uh;
  uint __vl;
  uint __ul;
  mp_limb_t __x3;
  mp_limb_t __x2;
  mp_limb_t __x1;
  mp_limb_t __x0;
  int LOCAL_GMP_LIMB_BITS;
  mp_limb_t _mask;
  mp_limb_t _r;
  mp_limb_t _ql;
  mp_limb_t _qh;
  mp_limb_t q;
  mp_size_t tn;
  mp_ptr tp;
  mp_limb_t r;
  mp_limb_t di;
  mp_limb_t d;
  mp_size_t in_stack_ffffffffffffff38;
  mp_ptr in_stack_ffffffffffffff40;
  long local_98;
  ulong local_68;
  mp_limb_t local_58;
  mp_size_t local_48;
  mp_ptr local_40;
  mp_limb_t local_38;
  long local_18;
  mp_srcptr local_10;
  
  local_48 = 0;
  if (*in_RCX == 0) {
    local_38 = 0;
    local_10 = in_RSI;
  }
  else {
    local_40 = in_RDI;
    if (in_RDI == (mp_ptr)0x0) {
      local_40 = gmp_alloc_limbs(0x9ad8d8);
      local_48 = in_RDX;
    }
    local_38 = mpn_lshift(local_40,in_RSI,in_RDX,*in_RCX);
    local_10 = local_40;
  }
  uVar1 = *(ulong *)(in_RCX + 2);
  uVar2 = *(ulong *)(in_RCX + 6);
  local_18 = in_RDX;
  while (local_18 = local_18 + -1, -1 < local_18) {
    uVar3 = (uint)(local_38 >> 0x20);
    uVar4 = (uint)(uVar2 >> 0x20);
    uVar5 = (local_38 & 0xffffffff) * (uVar2 & 0xffffffff);
    uVar6 = (ulong)uVar3 * (uVar2 & 0xffffffff);
    local_98 = (ulong)uVar3 * (ulong)uVar4;
    uVar7 = uVar6 + (uVar5 >> 0x20) + (local_38 & 0xffffffff) * (ulong)uVar4;
    if (uVar7 < uVar6) {
      local_98 = local_98 + 0x100000000;
    }
    pmVar8 = (mp_ptr)((uVar7 << 0x20) + (uVar5 & 0xffffffff));
    in_stack_ffffffffffffff40 = (mp_ptr)((long)pmVar8 + local_10[local_18]);
    lVar9 = local_98 + (uVar7 >> 0x20) + local_38 + 1 + (ulong)(in_stack_ffffffffffffff40 < pmVar8);
    pmVar8 = (mp_ptr)(local_10[local_18] - lVar9 * uVar1);
    uVar5 = -(ulong)(in_stack_ffffffffffffff40 < pmVar8);
    local_58 = uVar5 + lVar9;
    local_68 = (uVar5 & uVar1) + (long)pmVar8;
    if (uVar1 <= local_68) {
      local_68 = local_68 - uVar1;
      local_58 = local_58 + 1;
    }
    local_38 = local_68;
    if (in_RDI != (mp_ptr)0x0) {
      in_RDI[local_18] = local_58;
    }
  }
  if (local_48 != 0) {
    gmp_free_limbs(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  return local_38 >> ((byte)*in_RCX & 0x3f);
}

Assistant:

static mp_limb_t
mpn_div_qr_1_preinv (mp_ptr qp, mp_srcptr np, mp_size_t nn,
		     const struct gmp_div_inverse *inv)
{
  mp_limb_t d, di;
  mp_limb_t r;
  mp_ptr tp = NULL;
  mp_size_t tn = 0;

  if (inv->shift > 0)
    {
      /* Shift, reusing qp area if possible. In-place shift if qp == np. */
      tp = qp;
      if (!tp)
        {
	   tn = nn;
	   tp = gmp_alloc_limbs (tn);
        }
      r = mpn_lshift (tp, np, nn, inv->shift);
      np = tp;
    }
  else
    r = 0;

  d = inv->d1;
  di = inv->di;
  while (--nn >= 0)
    {
      mp_limb_t q;

      gmp_udiv_qrnnd_preinv (q, r, r, np[nn], d, di);
      if (qp)
	qp[nn] = q;
    }
  if (tn)
    gmp_free_limbs (tp, tn);

  return r >> inv->shift;
}